

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_get_opcode_data(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *in_RCX;
  long lVar6;
  undefined8 in_RSI;
  long in_RDI;
  sexp_conflict data;
  sexp_conflict local_40;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x1b)) {
    local_40 = *(sexp_conflict *)(in_RCX + 4);
    if (local_40 == (sexp_conflict)0x0) {
      local_8 = (sexp_conflict)0x43e;
    }
    else {
      if ((((char)in_RCX[0x18] == '\x02') &&
          (lVar6 = (long)local_40 >> 0x3f, auVar2._8_8_ = lVar6,
          auVar2._0_8_ = (ulong)local_40 & 0xfffffffffffffffe, -1 < SUB168(auVar2 / SEXT816(2),0)))
         && (auVar3._8_8_ = lVar6, auVar3._0_8_ = (ulong)local_40 & 0xfffffffffffffffe,
            uVar1 = *(ulong *)(*(long *)(in_RDI + 0x28) + 0x30), auVar4._8_8_ = (long)uVar1 >> 0x3f,
            auVar4._0_8_ = uVar1 & 0xfffffffffffffffe,
            SUB168(auVar3 / SEXT816(2),0) <= SUB168(auVar4 / SEXT816(2),0))) {
        auVar5._8_8_ = lVar6;
        auVar5._0_8_ = (ulong)local_40 & 0xfffffffffffffffe;
        local_40 = *(sexp_conflict *)
                    (*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 +
                    SUB168(auVar5 / SEXT816(2),0) * 8);
      }
      local_8 = local_40;
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x1b,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_get_opcode_data (sexp ctx, sexp self, sexp_sint_t n, sexp op) {
  sexp data;
  sexp_assert_type(ctx, sexp_opcodep, SEXP_OPCODE, op);
  data = sexp_opcode_data(op);
  if (!data) return SEXP_VOID;
  return sexp_opcode_class(op) == SEXP_OPC_TYPE_PREDICATE
    && 0 <= sexp_unbox_fixnum(data)
    && sexp_unbox_fixnum(data) <= sexp_context_num_types(ctx) ?
    sexp_type_by_index(ctx, sexp_unbox_fixnum(data)) : data;
}